

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_index.c
# Opt level: O0

int cram_index_load(cram_fd *fd,char *fn)

{
  int64_t iVar1;
  int iVar2;
  cram_index *pcVar3;
  hFILE *fp_00;
  char *pcVar4;
  bool bVar5;
  int iStack_110c8;
  size_t index_end;
  char *s;
  size_t l;
  size_t pos;
  int idx_stack_ptr;
  int idx_stack_alloc;
  cram_index e;
  cram_index *ep;
  cram_index **idx_stack;
  cram_index *idx;
  hFILE *fp;
  kstring_t kstr;
  ssize_t len;
  char buf [65536];
  char fn2 [4096];
  char *fn_local;
  cram_fd *fd_local;
  
  memset(&fp,0,0x18);
  pos._4_4_ = 0;
  pos._0_4_ = 0;
  l = 0;
  if (fd->index == (cram_index *)0x0) {
    fd->index_sz = 1;
    pcVar3 = (cram_index *)calloc(1,0x30);
    fd->index = pcVar3;
    if (fd->index == (cram_index *)0x0) {
      fd_local._4_4_ = -1;
    }
    else {
      idx_stack = (cram_index **)fd->index;
      ((cram_index *)idx_stack)->refid = -1;
      ((cram_index *)idx_stack)->start = -0x80000000;
      ((cram_index *)idx_stack)->end = 0x7fffffff;
      pos._4_4_ = pos._4_4_ + 1;
      ep = (cram_index *)calloc((long)pos._4_4_,8);
      *(cram_index ***)(&ep->nslice + (long)(int)pos * 2) = idx_stack;
      sprintf(buf + 0xfff8,"%s.crai",fn);
      fp_00 = hopen(buf + 0xfff8,"r");
      if (fp_00 == (hFILE *)0x0) {
        perror(buf + 0xfff8);
        free(ep);
        fd_local._4_4_ = -1;
      }
      else {
        while (kstr.s = (char *)hread(fp_00,&len,0x10000), 0 < (long)kstr.s) {
          kputsn((char *)&len,(int)kstr.s,(kstring_t *)&fp);
        }
        if (((long)kstr.s < 0) || (fp < (hFILE *)0x2)) {
          if (kstr.m != 0) {
            free((void *)kstr.m);
          }
          free(ep);
          fd_local._4_4_ = -1;
        }
        else {
          iVar2 = hclose(fp_00);
          if (iVar2 == 0) {
            if ((*(char *)kstr.m == '\x1f') && (*(char *)(kstr.m + 1) == -0x75)) {
              pcVar4 = zlib_mem_inflate((char *)kstr.m,(size_t)fp,(size_t *)&s);
              free((void *)kstr.m);
              if (pcVar4 == (char *)0x0) {
                free(ep);
                return -1;
              }
              fp = (hFILE *)s;
              kstr.l = (size_t)s;
              kstr.m = (size_t)pcVar4;
              kputsn("",0,(kstring_t *)&fp);
            }
            do {
              iVar2 = kget_int32((kstring_t *)&fp,&l,(int32_t *)&e.e);
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              iVar2 = kget_int32((kstring_t *)&fp,&l,(int32_t *)((long)&e.e + 4));
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              iVar2 = kget_int32((kstring_t *)&fp,&l,&e.refid);
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              iVar2 = kget_int64((kstring_t *)&fp,&l,(int64_t *)&e.slice);
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              iVar2 = kget_int32((kstring_t *)&fp,&l,&e.end);
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              iVar2 = kget_int32((kstring_t *)&fp,&l,&e.nseq);
              if (iVar2 == -1) {
                free((void *)kstr.m);
                free(ep);
                return -1;
              }
              e.refid = e.e._4_4_ + -1 + e.refid;
              if ((int)(uint)e.e < -1) {
                free((void *)kstr.m);
                free(ep);
                fprintf(_stderr,"Malformed index file, refid %d\n",(ulong)(uint)e.e);
                return -1;
              }
              if ((uint)e.e != *(uint *)(idx_stack + 2)) {
                if (fd->index_sz < (int)((uint)e.e + 2)) {
                  iVar2 = fd->index_sz;
                  fd->index_sz = (uint)e.e + 2;
                  pcVar3 = (cram_index *)realloc(fd->index,(long)fd->index_sz * 0x30);
                  fd->index = pcVar3;
                  memset(fd->index + iVar2,0,(long)fd->index_sz * 0x30 + (long)iVar2 * -0x30);
                }
                idx_stack = (cram_index **)(fd->index + (int)((uint)e.e + 1));
                ((cram_index *)idx_stack)->refid = (uint)e.e;
                ((cram_index *)idx_stack)->start = -0x80000000;
                ((cram_index *)idx_stack)->end = 0x7fffffff;
                ((cram_index *)idx_stack)->nalloc = 0;
                ((cram_index *)idx_stack)->nslice = 0;
                ((cram_index *)idx_stack)->e = (cram_index *)0x0;
                pos._0_4_ = 0;
                *(cram_index ***)ep = idx_stack;
              }
              while( true ) {
                bVar5 = false;
                if (*(int *)((long)idx_stack + 0x14) <= e.e._4_4_) {
                  bVar5 = e.refid <= *(int *)(idx_stack + 3);
                }
                if (bVar5) break;
                pos._0_4_ = (int)pos + -1;
                idx_stack = *(cram_index ***)(&ep->nslice + (long)(int)pos * 2);
              }
              if (*(int *)((long)idx_stack + 4) <= *(int *)idx_stack + 1) {
                if (*(int *)((long)idx_stack + 4) == 0) {
                  iStack_110c8 = 0x10;
                }
                else {
                  iStack_110c8 = *(int *)((long)idx_stack + 4) << 1;
                }
                *(int *)((long)idx_stack + 4) = iStack_110c8;
                pcVar3 = (cram_index *)
                         realloc(idx_stack[1],(long)*(int *)((long)idx_stack + 4) * 0x30);
                idx_stack[1] = pcVar3;
              }
              idx_stack_ptr = 0;
              idx_stack_alloc = 0;
              e.nslice = 0;
              e.nalloc = 0;
              iVar2 = *(int *)idx_stack;
              *(int *)idx_stack = iVar2 + 1;
              e.offset = (int64_t)(idx_stack[1] + iVar2);
              memcpy((void *)e.offset,&idx_stack_ptr,0x30);
              iVar1 = e.offset;
              idx_stack = (cram_index **)e.offset;
              pos._0_4_ = (int)pos + 1;
              if (pos._4_4_ <= (int)pos) {
                pos._4_4_ = pos._4_4_ << 1;
                ep = (cram_index *)realloc(ep,(long)pos._4_4_ << 3);
              }
              *(int64_t *)(&ep->nslice + (long)(int)pos * 2) = iVar1;
              while( true ) {
                bVar5 = false;
                if (l < fp) {
                  bVar5 = *(char *)(kstr.m + l) != '\n';
                }
                if (!bVar5) break;
                l = l + 1;
              }
              l = l + 1;
            } while (l < fp);
            free(ep);
            free((void *)kstr.m);
            fd_local._4_4_ = 0;
          }
          else {
            if (kstr.m != 0) {
              free((void *)kstr.m);
            }
            free(ep);
            fd_local._4_4_ = -1;
          }
        }
      }
    }
  }
  else {
    fd_local._4_4_ = 0;
  }
  return fd_local._4_4_;
}

Assistant:

int cram_index_load(cram_fd *fd, const char *fn) {
    char fn2[PATH_MAX];
    char buf[65536];
    ssize_t len;
    kstring_t kstr = {0};
    hFILE *fp;
    cram_index *idx;
    cram_index **idx_stack = NULL, *ep, e;
    int idx_stack_alloc = 0, idx_stack_ptr = 0;
    size_t pos = 0;

    /* Check if already loaded */
    if (fd->index)
	return 0;

    fd->index = calloc((fd->index_sz = 1), sizeof(*fd->index));
    if (!fd->index)
	return -1;

    idx = &fd->index[0];
    idx->refid = -1;
    idx->start = INT_MIN;
    idx->end   = INT_MAX;

    idx_stack = calloc(++idx_stack_alloc, sizeof(*idx_stack));
    idx_stack[idx_stack_ptr] = idx;

    sprintf(fn2, "%s.crai", fn);
    if (!(fp = hopen(fn2, "r"))) {
	perror(fn2);
	free(idx_stack);
	return -1; 
    }

    // Load the file into memory
    while ((len = hread(fp, buf, 65536)) > 0)
	kputsn(buf, len, &kstr);
    if (len < 0 || kstr.l < 2) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }

    if (hclose(fp)) {
	if (kstr.s)
	    free(kstr.s);
	free(idx_stack);
	return -1;
    }
	

    // Uncompress if required
    if (kstr.s[0] == 31 && (uc)kstr.s[1] == 139) {
	size_t l;
	char *s = zlib_mem_inflate(kstr.s, kstr.l, &l);
	free(kstr.s);
	if (!s) {
	    free(idx_stack);
	    return -1;
	}
	kstr.s = s;
	kstr.l = l;
	kstr.m = l; // conservative estimate of the size allocated
	kputsn("", 0, &kstr); // ensure kstr.s is NUL-terminated
    }


    // Parse it line at a time
    do {
	/* 1.1 layout */
	if (kget_int32(&kstr, &pos, &e.refid) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.start) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.end) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int64(&kstr, &pos, &e.offset) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.slice) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}
	if (kget_int32(&kstr, &pos, &e.len) == -1) {
	    free(kstr.s); free(idx_stack); return -1;
	}

	e.end += e.start-1;
	//printf("%d/%d..%d\n", e.refid, e.start, e.end);

	if (e.refid < -1) {
	    free(kstr.s);
	    free(idx_stack);
	    fprintf(stderr, "Malformed index file, refid %d\n", e.refid);
	    return -1;
	}

	if (e.refid != idx->refid) {
	    if (fd->index_sz < e.refid+2) {
		size_t index_end = fd->index_sz * sizeof(*fd->index);
		fd->index_sz = e.refid+2;
		fd->index = realloc(fd->index,
				    fd->index_sz * sizeof(*fd->index));
		memset(((char *)fd->index) + index_end, 0,
		       fd->index_sz * sizeof(*fd->index) - index_end);
	    }
	    idx = &fd->index[e.refid+1];
	    idx->refid = e.refid;
	    idx->start = INT_MIN;
	    idx->end   = INT_MAX;
	    idx->nslice = idx->nalloc = 0;
	    idx->e = NULL;
	    idx_stack[(idx_stack_ptr = 0)] = idx;
	}

	while (!(e.start >= idx->start && e.end <= idx->end)) {
	    idx = idx_stack[--idx_stack_ptr];
	}

	// Now contains, so append
	if (idx->nslice+1 >= idx->nalloc) {
	    idx->nalloc = idx->nalloc ? idx->nalloc*2 : 16;
	    idx->e = realloc(idx->e, idx->nalloc * sizeof(*idx->e));
	}

	e.nalloc = e.nslice = 0; e.e = NULL;
	*(ep = &idx->e[idx->nslice++]) = e;
	idx = ep;

	if (++idx_stack_ptr >= idx_stack_alloc) {
	    idx_stack_alloc *= 2;
	    idx_stack = realloc(idx_stack, idx_stack_alloc*sizeof(*idx_stack));
	}
	idx_stack[idx_stack_ptr] = idx;

	while (pos < kstr.l && kstr.s[pos] != '\n')
	    pos++;
	pos++;
    } while (pos < kstr.l);

    free(idx_stack);
    free(kstr.s);

    // dump_index(fd);

    return 0;
}